

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

UsingDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::UsingDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::Expression&>
          (PoolAllocator *this,Context *args,Identifier *args_1,Expression *args_2)

{
  Identifier *c;
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_55 [13];
  pool_ptr<soul::AST::Expression> local_48;
  Identifier local_40;
  UsingDeclaration *local_38;
  UsingDeclaration *newObject;
  PoolItem *newItem;
  Expression *args_local_2;
  Identifier *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (Expression *)args_1;
  args_local_1 = (Identifier *)args;
  args_local = (Context *)this;
  newObject = (UsingDeclaration *)allocateSpaceForObject(this,0x40);
  c = args_local_1;
  this_00 = &(newObject->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject
             .context;
  local_40.name = (string *)(args_local_2->super_Statement).super_ASTObject._vptr_ASTObject;
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>
            (&local_48,(Expression *)newItem);
  AST::UsingDeclaration::UsingDeclaration
            ((UsingDeclaration *)this_00,(Context *)c,local_40,&local_48);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_48);
  local_38 = (UsingDeclaration *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::Identifier&,soul::AST::Expression&)::{lambda(void*)#1}
           ::operator_cast_to_function_pointer(local_55);
  *(DestructorFn **)
   &(newObject->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.
    objectType = pDVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }